

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O3

void __thiscall wasm::LocalGraph::computeSetInfluences(LocalGraph *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  __hashtable *__h;
  _Base_ptr p_Var3;
  LocalSet **ppLVar4;
  _Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_98;
  key_type local_90;
  LocalGet *get;
  Iterator ret_1;
  LocalSet *set;
  undefined1 local_50 [8];
  Iterator __begin3;
  
  p_Var3 = (this->locations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->locations)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      local_90 = *(key_type *)(p_Var3 + 1);
      if ((local_90->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id !=
          LocalGetId) {
        local_90 = (key_type)0x0;
      }
      if (local_90 != (key_type)0x0) {
        get = (LocalGet *)
              std::__detail::
              _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->getSetsMap,&local_90);
        ret_1.parent._0_1_ =
             (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                *)get)->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
        __begin3.fixedIndex = 0;
        local_50 = (undefined1  [8])get;
        __begin3.parent._0_1_ = ret_1.parent._0_1_;
        if ((bool)ret_1.parent._0_1_) {
          __begin3.usingFixed = false;
          __begin3._9_7_ = 0;
          ret_1.fixedIndex = 0;
          ret_1._8_8_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           *)&((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                *)get)->fixed)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>
                        .used;
        }
        else {
          __begin3.fixedIndex =
               (size_t)(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                          *)get)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          ret_1.fixedIndex =
               (size_t)&(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           *)get)->flexible)._M_t._M_impl.super__Rb_tree_header;
        }
        while( true ) {
          bVar2 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ::
                  IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                  ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                *)local_50,(Iterator *)&get);
          if (bVar2) break;
          ppLVar4 = (LocalSet **)(__begin3.fixedIndex + 0x20);
          if ((char)__begin3.parent != '\0') {
            ppLVar4 = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         *)local_50)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                      _M_elems + __begin3._8_8_;
          }
          ret_1.flexibleIterator._M_node = (_Base_ptr)*ppLVar4;
          local_98 = (_Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)std::__detail::
                        _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->setInfluences,(key_type *)&ret_1.flexibleIterator);
          std::
          _Hashtable<wasm::LocalGet*,wasm::LocalGet*,std::allocator<wasm::LocalGet*>,std::__detail::_Identity,std::equal_to<wasm::LocalGet*>,std::hash<wasm::LocalGet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::LocalGet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalGet*,false>>>>
                    (local_98,&local_90,&local_98);
          if ((char)__begin3.parent == '\x01') {
            __begin3._8_8_ = __begin3._8_8_ + 1;
          }
          else {
            __begin3.fixedIndex = std::_Rb_tree_increment((_Rb_tree_node_base *)__begin3.fixedIndex)
            ;
          }
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  return;
}

Assistant:

void LocalGraph::computeSetInfluences() {
  for (auto& [curr, _] : locations) {
    if (auto* get = curr->dynCast<LocalGet>()) {
      for (auto* set : getSetsMap[get]) {
        setInfluences[set].insert(get);
      }
    }
  }
}